

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

Locked<const_std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> __thiscall
kj::MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::lockShared
          (MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
           *this,Mutex *param_2)

{
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *extraout_RDX;
  Locked<const_std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> LVar1;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_30;
  Mutex *local_20;
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *this_local;
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *local_10;
  
  local_20 = param_2;
  local_10 = this;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe();
  kj::_::Mutex::lock(param_2,1,&local_30);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_30);
  Locked<const_std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::Locked
            ((Locked<const_std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *
             )this,param_2,
             (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)(param_2 + 1));
  LVar1.ptr = extraout_RDX;
  LVar1.mutex = &this->mutex;
  return LVar1;
}

Assistant:

inline Locked<const T> MutexGuarded<T>::lockShared(LockSourceLocationArg location) const {
  mutex.lock(_::Mutex::SHARED, kj::none, location);
  return Locked<const T>(mutex, value);
}